

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_realloc(void *msp,void *ptr,size_t nsize)

{
  mchunkptr oldp_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  size_t local_c0;
  ulong local_98;
  size_t oc;
  void *newmem;
  mchunkptr newtop;
  size_t newtopsize;
  size_t newsize;
  mchunkptr rem;
  size_t rsize;
  size_t nb;
  mchunkptr newp;
  mchunkptr next;
  size_t oldsize;
  mchunkptr oldp;
  mstate m;
  size_t nsize_local;
  void *ptr_local;
  void *msp_local;
  
  if (nsize < 0xffffffffffffff80) {
    oldp_00 = (mchunkptr)((long)ptr + -0x10);
    uVar1 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
    nb = 0;
    if (nsize < 0x17) {
      local_98 = 0x20;
    }
    else {
      local_98 = nsize + 0xf & 0xfffffffffffffff8;
    }
    if (((*(ulong *)((long)ptr + -8) & 1) == 0) && ((oldp_00->prev_foot & 1) != 0)) {
      nb = (size_t)direct_resize(oldp_00,local_98);
    }
    else if (uVar1 < local_98) {
      if (((long)&oldp_00->prev_foot + uVar1 == *(long *)((long)msp + 0x20)) &&
         (local_98 < uVar1 + *(long *)((long)msp + 0x10))) {
        uVar2 = (uVar1 + *(long *)((long)msp + 0x10)) - local_98;
        lVar3 = (long)&oldp_00->prev_foot + local_98;
        *(ulong *)((long)ptr + -8) = *(ulong *)((long)ptr + -8) & 1 | local_98 | 2;
        *(ulong *)((long)ptr + (local_98 - 8)) = *(ulong *)((long)ptr + (local_98 - 8)) | 1;
        *(ulong *)(lVar3 + 8) = uVar2 | 1;
        *(long *)((long)msp + 0x20) = lVar3;
        *(ulong *)((long)msp + 0x10) = uVar2;
        nb = (size_t)oldp_00;
      }
    }
    else {
      uVar2 = uVar1 - local_98;
      nb = (size_t)oldp_00;
      if (0x1f < uVar2) {
        *(ulong *)((long)ptr + -8) = *(ulong *)((long)ptr + -8) & 1 | local_98 | 2;
        *(ulong *)((long)ptr + (local_98 - 8)) = *(ulong *)((long)ptr + (local_98 - 8)) | 1;
        *(ulong *)((long)&oldp_00->head + local_98) =
             *(ulong *)((long)&oldp_00->head + local_98) & 1 | uVar2 | 2;
        *(ulong *)((long)oldp_00 + uVar2 + local_98 + 8) =
             *(ulong *)((long)oldp_00 + uVar2 + local_98 + 8) | 1;
        lj_alloc_free(msp,(void *)((long)&oldp_00->fd + local_98));
      }
    }
    if (nb == 0) {
      msp_local = lj_alloc_malloc(msp,nsize);
      if (msp_local != (void *)0x0) {
        bVar4 = false;
        if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
          bVar4 = (oldp_00->prev_foot & 1) != 0;
        }
        lVar3 = 8;
        if (bVar4) {
          lVar3 = 0x10;
        }
        local_c0 = nsize;
        if (uVar1 - lVar3 < nsize) {
          local_c0 = uVar1 - lVar3;
        }
        memcpy(msp_local,ptr,local_c0);
        lj_alloc_free(msp,ptr);
      }
    }
    else {
      msp_local = (void *)(nb + 0x10);
    }
  }
  else {
    msp_local = (void *)0x0;
  }
  return msp_local;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_realloc(void *msp, void *ptr, size_t nsize)
{
  if (nsize >= MAX_REQUEST) {
    return NULL;
  } else {
    mstate m = (mstate)msp;
    mchunkptr oldp = mem2chunk(ptr);
    size_t oldsize = chunksize(oldp);
    mchunkptr next = chunk_plus_offset(oldp, oldsize);
    mchunkptr newp = 0;
    size_t nb = request2size(nsize);

    /* Try to either shrink or extend into top. Else malloc-copy-free */
    if (is_direct(oldp)) {
      newp = direct_resize(oldp, nb);  /* this may return NULL. */
    } else if (oldsize >= nb) { /* already big enough */
      size_t rsize = oldsize - nb;
      newp = oldp;
      if (rsize >= MIN_CHUNK_SIZE) {
	mchunkptr rem = chunk_plus_offset(newp, nb);
	set_inuse(m, newp, nb);
	set_inuse(m, rem, rsize);
	lj_alloc_free(m, chunk2mem(rem));
      }
    } else if (next == m->top && oldsize + m->topsize > nb) {
      /* Expand into top */
      size_t newsize = oldsize + m->topsize;
      size_t newtopsize = newsize - nb;
      mchunkptr newtop = chunk_plus_offset(oldp, nb);
      set_inuse(m, oldp, nb);
      newtop->head = newtopsize |PINUSE_BIT;
      m->top = newtop;
      m->topsize = newtopsize;
      newp = oldp;
    }

    if (newp != 0) {
      return chunk2mem(newp);
    } else {
      void *newmem = lj_alloc_malloc(m, nsize);
      if (newmem != 0) {
	size_t oc = oldsize - overhead_for(oldp);
	memcpy(newmem, ptr, oc < nsize ? oc : nsize);
	lj_alloc_free(m, ptr);
      }
      return newmem;
    }
  }
}